

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall pbrt::BDPTIntegrator::Render(BDPTIntegrator *this)

{
  optional<float> oVar1;
  bool bVar2;
  ushort uVar3;
  RGBColorSpace *colorSpace;
  BDPTIntegrator *pBVar4;
  int iVar5;
  Allocator AVar6;
  PixelSensor *pPVar7;
  RGBFilm *this_00;
  int *piVar8;
  pointer pFVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  pointer pFVar13;
  uintptr_t iptr;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar17;
  int t;
  string filename;
  ImageMetadata metadata;
  int local_2f0;
  int local_2ec;
  float local_2e8;
  int local_2e4;
  string local_2e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0 [2];
  BDPTIntegrator *local_290;
  undefined1 local_288 [64];
  undefined8 local_248;
  bool local_240;
  bool local_1fc;
  bool local_1e8;
  bool local_1dc;
  bool local_1d4;
  bool local_1cc;
  bool local_1c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_1b8;
  undefined1 local_188 [48];
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  ImageMetadata local_130;
  
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    local_2c0 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&this->weightFilms;
    std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::resize
              ((vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)local_2c0,
               (long)(((this->maxDepth + 6) * (this->maxDepth + 1)) / 2));
    local_2ec = 0;
    pBVar4 = this;
    if (-1 < this->maxDepth) {
      do {
        local_290 = pBVar4;
        local_2f0 = 0;
        if (-3 < local_2ec) {
          iVar5 = local_2ec + 2;
          do {
            local_2e4 = iVar5 - local_2f0;
            if ((local_2e4 != 0) && ((local_2f0 != 1 || (local_2e4 != 1)))) {
              local_2e0._M_string_length = 0;
              local_2e0.field_2._M_local_buf[0] = '\0';
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              detail::stringPrintfRecursive<int&,int&,int&>
                        (&local_2e0,"bdpt_d%02i_s%02i_t%02i.exr",&local_2ec,&local_2f0,&local_2e4);
              uVar14 = (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits & 0xffffffffffff;
              oVar1 = *(optional<float> *)(*(ulong *)(uVar14 + 0x340) & 0xffffffffffff);
              aVar17 = oVar1.optionalValue;
              uVar11 = 0;
              if (0 < (int)aVar17) {
                uVar11 = (ulong)oVar1 & 0xffffffff;
              }
              uVar12 = oVar1._4_4_;
              uVar16 = 0;
              if (uVar12 != 0 && -1 < (long)oVar1) {
                uVar16 = (ulong)uVar12;
              }
              local_2b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)operator_new(8);
              *(undefined8 *)local_2b8 = 0x3f0000003f000000;
              local_2e8 = *(float *)((*(ulong *)(uVar14 + 0x340) & 0xffffffffffff) + 0x20) * 1000.0;
              AVar6.memoryResource = pstd::pmr::new_delete_resource();
              pPVar7 = PixelSensor::CreateDefault(AVar6);
              local_2b0 = local_2a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,local_2e0._M_dataplus._M_p,
                         local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
              local_288._8_4_ = (int)aVar17 >> 0x1f & (uint)aVar17;
              local_288._12_4_ = (int)uVar12 >> 0x1f & uVar12;
              local_288._16_8_ = uVar11 | uVar16 << 0x20;
              local_288._24_8_ = (ulong)local_2b8 | 0x1000000000000;
              local_288._32_4_ = local_2e8;
              local_288._0_8_ = oVar1;
              local_288._40_8_ = pPVar7;
              local_288._48_8_ = &local_248;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_288 + 0x30),local_2b0,local_2a8 + (long)local_2b0);
              this = local_290;
              if (local_2b0 != local_2a0) {
                operator_delete(local_2b0,local_2a0[0] + 1);
              }
              this_00 = (RGBFilm *)operator_new(0xa8);
              local_188._0_8_ = local_288._0_8_;
              local_188._8_8_ = local_288._8_8_;
              local_188._16_8_ = local_288._16_8_;
              local_188._24_8_ = local_288._24_8_;
              local_188._36_4_ = local_288._36_4_;
              local_188._32_4_ = (Float)local_288._32_4_;
              local_188._40_8_ = local_288._40_8_;
              local_158._M_p = (pointer)&local_148;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,local_288._48_8_,local_288._56_8_ + local_288._48_8_);
              colorSpace = RGBColorSpace::sRGB;
              AVar6.memoryResource = pstd::pmr::new_delete_resource();
              RGBFilm::RGBFilm(this_00,(FilmBaseParameters *)local_188,colorSpace,INFINITY,true,
                               AVar6);
              (((_Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *)
               &local_2c0->_M_t)->_M_impl).super__Vector_impl_data._M_start
              [((local_2e4 + 3 + local_2f0) * (local_2e4 + -2 + local_2f0)) / 2 + local_2f0].
              super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
                   (ulong)this_00 | 0x1000000000000;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_p != &local_148) {
                operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
              }
              if ((undefined8 *)local_288._48_8_ != &local_248) {
                operator_delete((void *)local_288._48_8_,local_248 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                operator_delete(local_2e0._M_dataplus._M_p,
                                CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                         local_2e0.field_2._M_local_buf[0]) + 1);
              }
            }
            iVar10 = local_2f0 + 1;
            iVar5 = local_2ec + 2;
            bVar2 = local_2f0 < iVar5;
            local_2f0 = iVar10;
          } while (bVar2);
        }
        iVar5 = local_2ec + 1;
        bVar2 = local_2ec < this->maxDepth;
        local_2ec = iVar5;
        pBVar4 = local_290;
      } while (bVar2);
    }
  }
  ImageTileIntegrator::Render((ImageTileIntegrator *)this);
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    uVar11 = (this->super_RayIntegrator).super_ImageTileIntegrator.samplerPrototype.
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             .bits;
    uVar14 = uVar11 >> 0x30;
    piVar8 = (int *)(uVar11 & 0xffffffffffff);
    uVar3 = (ushort)(uVar11 >> 0x30);
    if (uVar14 < 5) {
      uVar12 = (uint)(uVar14 != 2) << 3;
      if (2 < uVar3) {
        uVar12 = (uint)(uVar14 == 3) << 4;
      }
      iVar5 = *(int *)((long)piVar8 + (ulong)uVar12);
    }
    else if (uVar3 < 7) {
      iVar5 = *piVar8;
      if (uVar3 == 6) {
        iVar5 = iVar5 * piVar8[1];
      }
    }
    else {
      iVar5 = *piVar8;
    }
    pFVar13 = (this->weightFilms).
              super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar9 = (this->weightFilms).
             super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar9 != pFVar13) {
      local_2e8 = 1.0 / (float)iVar5;
      local_2c0 = &local_130.stringVectors;
      local_2b8 = &_Stack_1b8;
      lVar15 = 0;
      uVar11 = 0;
      do {
        local_288[4] = 0;
        local_240 = false;
        local_1fc = false;
        local_1e8 = false;
        local_1dc = false;
        local_1d4 = false;
        local_1cc = false;
        local_1c0 = false;
        _Stack_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_1b8._M_impl.super__Rb_tree_header._M_header;
        _Stack_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((*(ulong *)((long)&(pFVar13->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits
                       + lVar15) & 0xffffffffffff) != 0) {
          ImageMetadata::ImageMetadata(&local_130,(ImageMetadata *)local_288);
          FilmHandle::WriteImage
                    ((FilmHandle *)
                     ((long)&(pFVar13->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits +
                     lVar15),&local_130,local_2e8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_2c0->_M_t);
          if (local_130.colorSpace.set == true) {
            local_130.colorSpace.set = false;
          }
          if (local_130.MSE.set == true) {
            local_130.MSE.set = false;
          }
          if (local_130.samplesPerPixel.set == true) {
            local_130.samplesPerPixel.set = false;
          }
          if (local_130.fullResolution.set == true) {
            local_130.fullResolution.set = false;
          }
          if (local_130.pixelBounds.set == true) {
            local_130.pixelBounds.set = false;
          }
          if (local_130.NDCFromWorld.set == true) {
            local_130.NDCFromWorld.set = false;
          }
          if (local_130.cameraFromWorld.set == true) {
            local_130.cameraFromWorld.set = false;
          }
          if (local_130.renderTimeSeconds.set == true) {
            local_130.renderTimeSeconds.set = false;
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(local_2b8);
        if ((bool)local_288[4] == true) {
          local_288[4] = 0;
        }
        uVar11 = uVar11 + 1;
        pFVar13 = (this->weightFilms).
                  super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar9 = (this->weightFilms).
                 super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar15 = lVar15 + 8;
      } while (uVar11 < (ulong)((long)pFVar9 - (long)pFVar13 >> 3));
    }
    if (pFVar9 != pFVar13) {
      (this->weightFilms).super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish = pFVar13;
    }
  }
  return;
}

Assistant:

void BDPTIntegrator::Render() {
    // Allocate buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const int bufferCount = (1 + maxDepth) * (6 + maxDepth) / 2;
        weightFilms.resize(bufferCount);
        for (int depth = 0; depth <= maxDepth; ++depth) {
            for (int s = 0; s <= depth + 2; ++s) {
                int t = depth + 2 - s;
                if (t == 0 || (s == 1 && t == 1))
                    continue;

                std::string filename =
                    StringPrintf("bdpt_d%02i_s%02i_t%02i.exr", depth, s, t);

                FilmBaseParameters p(
                    camera.GetFilm().FullResolution(),
                    Bounds2i(Point2i(0, 0), camera.GetFilm().FullResolution()),
                    new BoxFilter,  // FIXME: leaks
                    camera.GetFilm().Diagonal() * 1000, PixelSensor::CreateDefault(),
                    filename);
                weightFilms[BufferIndex(s, t)] = new RGBFilm(p, RGBColorSpace::sRGB);
            }
        }
    }

    RayIntegrator::Render();

    // Write buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const Float invSampleCount = 1.0f / samplerPrototype.SamplesPerPixel();
        for (size_t i = 0; i < weightFilms.size(); ++i) {
            ImageMetadata metadata;
            if (weightFilms[i])
                weightFilms[i].WriteImage(metadata, invSampleCount);
        }
        weightFilms.clear();
    }
}